

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonDlBlobTypeValReq::_validate(JsonDlBlobTypeValReq *this,JsonVal *jsonVal)

{
  JsonObjValReq::_validate((JsonObjValReq *)this,jsonVal);
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonDtValReq::_validate(jsonVal);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid dynamic-length BLOB type:",
                                      jsonVal.loc());
            throw;
        }
    }